

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

void cm_expat_XML_ParserFree(XML_Parser parser)

{
  NAMED *pNVar1;
  undefined8 *puVar2;
  void *__src;
  DTD tem;
  HASH_TABLE_ITER local_158 [19];
  
  do {
    puVar2 = *(undefined8 **)((long)parser + 0x3d0);
    if (puVar2 == (undefined8 *)0x0) {
      puVar2 = *(undefined8 **)((long)parser + 0x3d8);
      if (puVar2 == (undefined8 *)0x0) {
        destroyBindings(*(BINDING **)((long)parser + 1000),parser);
        destroyBindings(*(BINDING **)((long)parser + 0x3e0),parser);
        poolDestroy((STRING_POOL *)((long)parser + 0x418));
        poolDestroy((STRING_POOL *)((long)parser + 0x448));
        if (*(long *)((long)parser + 0x490) != 0) {
          if (*(int *)((long)parser + 0x484) != 0) {
            *(undefined4 *)((long)parser + 0x360) = 0;
          }
          __src = (void *)(*(long *)((long)parser + 0x490) + 0x290);
          memcpy(local_158,(void *)((long)parser + 0x290),0x138);
          memcpy((void *)((long)parser + 0x290),__src,0x138);
          memcpy(__src,local_158,0x138);
        }
        local_158[0].p = *(NAMED ***)((long)parser + 0x2b8);
        local_158[0].end = local_158[0].p + *(long *)((long)parser + 0x2c0);
        while( true ) {
          pNVar1 = hashTableIterNext(local_158);
          if (pNVar1 == (NAMED *)0x0) break;
          if (*(int *)((long)&pNVar1[3].name + 4) != 0) {
            (**(code **)((long)parser + 0x28))(pNVar1[4].name);
          }
        }
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x290));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x368));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x2b8));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x2e0));
        hashTableDestroy((HASH_TABLE *)((long)parser + 0x308));
        poolDestroy((STRING_POOL *)((long)parser + 0x330));
        if (*(long *)((long)parser + 0x3c0) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        if (*(long *)((long)parser + 0x3a8) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x400));
        if (*(long *)((long)parser + 0x478) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        if (*(long *)((long)parser + 0x10) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        (**(code **)((long)parser + 0x28))(*(undefined8 *)((long)parser + 0x58));
        if (*(long *)((long)parser + 0x1d0) != 0) {
          (**(code **)((long)parser + 0x28))();
        }
        if (*(code **)((long)parser + 0x1e8) != (code *)0x0) {
          (**(code **)((long)parser + 0x1e8))(*(undefined8 *)((long)parser + 0x1d8));
        }
        (**(code **)((long)parser + 0x28))(parser);
        return;
      }
      *(undefined8 *)((long)parser + 0x3d8) = 0;
    }
    *(undefined8 *)((long)parser + 0x3d0) = *puVar2;
    (**(code **)((long)parser + 0x28))(puVar2[6]);
    destroyBindings((BINDING *)puVar2[8],parser);
    (**(code **)((long)parser + 0x28))(puVar2);
  } while( true );
}

Assistant:

void XML_ParserFree(XML_Parser parser)
{
  for (;;) {
    TAG *p;
    if (tagStack == 0) {
      if (freeTagList == 0)
        break;
      tagStack = freeTagList;
      freeTagList = 0;
    }
    p = tagStack;
    tagStack = tagStack->parent;
    FREE(p->buf);
    destroyBindings(p->bindings, parser);
    FREE(p);
  }
  destroyBindings(freeBindingList, parser);
  destroyBindings(inheritedBindings, parser);
  poolDestroy(&tempPool);
  poolDestroy(&temp2Pool);
#ifdef XML_DTD
  if (parentParser) {
    if (hadExternalDoctype)
      dtd.complete = 0;
    dtdSwap(&dtd, &((Parser *)parentParser)->m_dtd);
  }
#endif /* XML_DTD */
  dtdDestroy(&dtd, parser);
  FREE((void *)atts);
  if (groupConnector)
    FREE(groupConnector);
  if (buffer)
    FREE(buffer);
  FREE(dataBuf);
  if (unknownEncodingMem)
    FREE(unknownEncodingMem);
  if (unknownEncodingRelease)
    unknownEncodingRelease(unknownEncodingData);
  FREE(parser);
}